

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O2

void __thiscall
QSequentialAnimationGroup::updateCurrentTime(QSequentialAnimationGroup *this,int currentTime)

{
  QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
  *this_00;
  QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
  *this_01;
  int *piVar1;
  int iVar2;
  QSequentialAnimationGroupPrivate *this_02;
  bool bVar3;
  parameter_type pVar4;
  parameter_type pVar5;
  parameter_type pQVar6;
  AnimationIndex AVar7;
  int iVar8;
  long in_FS_OFFSET;
  AnimationIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_02 = *(QSequentialAnimationGroupPrivate **)(this + 8);
  this_00 = &this_02->currentAnimation;
  pQVar6 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
           ::value(this_00);
  if (pQVar6 == (parameter_type)0x0) goto LAB_0036c1f0;
  AVar7 = QSequentialAnimationGroupPrivate::indexForCurrentTime(this_02);
  iVar8 = AVar7.index;
  local_40 = AVar7;
  while ((long)iVar8 < (this_02->actualDuration).d.size) {
    QList<int>::removeLast(&this_02->actualDuration);
  }
  iVar2 = this_02->lastLoop;
  this_01 = &(this_02->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentLoop;
  pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
          ::value(this_01);
  if (iVar2 < pVar4) {
LAB_0036c109:
    QSequentialAnimationGroupPrivate::advanceForwards(this_02,&local_40);
  }
  else {
    iVar2 = this_02->lastLoop;
    pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
            ::value(this_01);
    if ((iVar2 == pVar4) && (this_02->currentAnimationIndex < iVar8)) goto LAB_0036c109;
    iVar2 = this_02->lastLoop;
    pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
            ::value(this_01);
    if (pVar4 < iVar2) {
LAB_0036c145:
      QSequentialAnimationGroupPrivate::rewindForwards(this_02,&local_40);
    }
    else {
      iVar2 = this_02->lastLoop;
      pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
              ::value(this_01);
      if ((iVar2 == pVar4) && (iVar8 < this_02->currentAnimationIndex)) goto LAB_0036c145;
    }
  }
  QSequentialAnimationGroupPrivate::setCurrentAnimation(this_02,iVar8,false);
  pQVar6 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
           ::value(this_00);
  if (pQVar6 == (parameter_type)0x0) {
    (this_02->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime = 0;
LAB_0036c1d8:
    QAbstractAnimation::stop((QAbstractAnimation *)this);
  }
  else {
    iVar8 = currentTime - AVar7.timeOffset;
    QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
    ::value(this_00);
    QAbstractAnimation::setCurrentTime
              ((QAbstractAnimation *)
               (this_02->currentAnimation).super_QPropertyData<QAbstractAnimation_*>.val,iVar8);
    bVar3 = QSequentialAnimationGroupPrivate::atEnd(this_02);
    if (bVar3) {
      pQVar6 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
               ::value(this_00);
      pVar5 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
              ::value((QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_totalCurrentTime_offset,_&QAbstractAnimationPrivate::setCurrentTime,_nullptr,_nullptr>
                       *)&(pQVar6->super_QObject).d_ptr.d[1].field_0x30);
      piVar1 = &(this_02->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentTime;
      *piVar1 = *piVar1 + (pVar5 - iVar8);
      goto LAB_0036c1d8;
    }
  }
  pVar4 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
          ::value(this_01);
  this_02->lastLoop = pVar4;
LAB_0036c1f0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSequentialAnimationGroup::updateCurrentTime(int currentTime)
{
    Q_D(QSequentialAnimationGroup);
    if (!d->currentAnimation)
        return;

    const QSequentialAnimationGroupPrivate::AnimationIndex newAnimationIndex = d->indexForCurrentTime();

    // remove unneeded animations from actualDuration list
    while (newAnimationIndex.index < d->actualDuration.size())
        d->actualDuration.removeLast();

    // newAnimationIndex.index is the new current animation
    if (d->lastLoop < d->currentLoop
        || (d->lastLoop == d->currentLoop && d->currentAnimationIndex < newAnimationIndex.index)) {
            // advancing with forward direction is the same as rewinding with backwards direction
            d->advanceForwards(newAnimationIndex);
    } else if (d->lastLoop > d->currentLoop
        || (d->lastLoop == d->currentLoop && d->currentAnimationIndex > newAnimationIndex.index)) {
            // rewinding with forward direction is the same as advancing with backwards direction
            d->rewindForwards(newAnimationIndex);
    }

    d->setCurrentAnimation(newAnimationIndex.index);

    const int newCurrentTime = currentTime - newAnimationIndex.timeOffset;

    if (d->currentAnimation) {
        d->currentAnimation->setCurrentTime(newCurrentTime);
        if (d->atEnd()) {
            //we make sure that we don't exceed the duration here
            d->currentTime += QAbstractAnimationPrivate::get(d->currentAnimation)->totalCurrentTime - newCurrentTime;
            stop();
        }
    } else {
        //the only case where currentAnimation could be null
        //is when all animations have been removed
        Q_ASSERT(d->animations.isEmpty());
        d->currentTime = 0;
        stop();
    }

    d->lastLoop = d->currentLoop;
}